

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

void s3add_fattr(char *a,char *v,int dup)

{
  char *pcVar1;
  int dup_local;
  char *v_local;
  char *a_local;
  
  if (n_attrib == 0x80) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
            ,0x73,"Too many file attributes, increase MAX_ATTRIB\n");
    exit(1);
  }
  if (dup == 0) {
    attrib[n_attrib] = a;
    value[n_attrib] = v;
  }
  else {
    pcVar1 = strdup(a);
    attrib[n_attrib] = pcVar1;
    pcVar1 = strdup(v);
    value[n_attrib] = pcVar1;
  }
  alloc[n_attrib] = dup;
  n_attrib = n_attrib + 1;
  attrib[n_attrib] = (char *)0x0;
  value[n_attrib] = (char *)0x0;
  return;
}

Assistant:

void
s3add_fattr(char *a,
	    char *v,
	    int dup)
{

    if (n_attrib == MAX_ATTRIB) {
	E_FATAL("Too many file attributes, increase MAX_ATTRIB\n");
    }

    if (dup) {
	attrib[n_attrib] = strdup(a);
	value[n_attrib] = strdup(v);
    }
    else {
	attrib[n_attrib] = a;
	value[n_attrib] = v;
    }
    alloc[n_attrib] = dup;

    ++n_attrib;

    attrib[n_attrib] = NULL;
    value[n_attrib] = NULL;
}